

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderBuiltinVarTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::sr::anon_unknown_1::BuiltinGlFrontFacingCaseInstance::iterate
          (TestStatus *__return_storage_ptr__,BuiltinGlFrontFacingCaseInstance *this)

{
  UVec2 *pUVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var4;
  TestLog *log;
  int width;
  int height;
  bool bVar5;
  const_iterator cVar6;
  long *plVar7;
  size_type *psVar8;
  uint (*pauVar9) [2];
  ConstPixelBufferAccess *pCVar10;
  VkPrimitiveTopology extraout_EDX;
  VkPrimitiveTopology extraout_EDX_00;
  VkPrimitiveTopology extraout_EDX_01;
  VkPrimitiveTopology topology;
  void *__buf;
  void *__buf_00;
  vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> shaders;
  string local_518;
  string local_4f8;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertices;
  TextureFormat local_4b8;
  TestLog *local_4b0;
  string testDesc;
  LogImage local_488;
  DrawCallData drawCallData;
  ConstPixelBufferAccess local_3f0;
  DrawState drawState;
  ConstPixelBufferAccess local_3a8;
  ReferenceDrawContext refDrawContext;
  ConstPixelBufferAccess local_318;
  VulkanProgram vulkanProgram;
  FrontFacingVertexShader vertexShader;
  ConstPixelBufferAccess local_2a8;
  ConstPixelBufferAccess local_280;
  FrontFacingFragmentShader fragmentShader;
  VulkanDrawContext dc;
  
  local_4b0 = ((this->super_ShaderRenderCaseInstance).super_TestInstance.m_context)->m_testCtx->
              m_log;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  shaders.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shaders.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  shaders.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  rr::VertexShader::VertexShader(&vertexShader.super_VertexShader,1,0);
  vertexShader.super_VertexShader._vptr_VertexShader = (_func_int **)&PTR_shadeVertices_00d5a638;
  (vertexShader.super_VertexShader.m_inputs.
   super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  rr::FragmentShader::FragmentShader(&fragmentShader.super_FragmentShader,0,1);
  fragmentShader.super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&PTR_shadeFragments_00d5a668;
  (fragmentShader.super_FragmentShader.m_outputs.
   super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  testDesc._M_dataplus._M_p = (pointer)&testDesc.field_2;
  testDesc._M_string_length = 0;
  testDesc.field_2._M_local_buf[0] = '\0';
  dc.super_DrawContext._vptr_DrawContext = (_func_int **)0xbf400000bf400000;
  dc.super_DrawContext.m_drawState.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  dc.super_DrawContext.m_drawState.colorFormat = 0x3f800000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertices,
             (Vector<float,_4> *)&dc);
  dc.super_DrawContext._vptr_DrawContext = (_func_int **)0xbf40000000000000;
  dc.super_DrawContext.m_drawState.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  dc.super_DrawContext.m_drawState.colorFormat = 0x3f800000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertices,
             (Vector<float,_4> *)&dc);
  dc.super_DrawContext._vptr_DrawContext = (_func_int **)0x3f400000bebd70a4;
  dc.super_DrawContext.m_drawState.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  dc.super_DrawContext.m_drawState.colorFormat = 0x3f800000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertices,
             (Vector<float,_4> *)&dc);
  dc.super_DrawContext._vptr_DrawContext = (_func_int **)0x3f4000003ebd70a4;
  dc.super_DrawContext.m_drawState.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  dc.super_DrawContext.m_drawState.colorFormat = 0x3f800000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertices,
             (Vector<float,_4> *)&dc);
  dc.super_DrawContext._vptr_DrawContext = (_func_int **)0xbf4000003f400000;
  dc.super_DrawContext.m_drawState.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  dc.super_DrawContext.m_drawState.colorFormat = 0x3f800000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertices,
             (Vector<float,_4> *)&dc);
  dc.super_DrawContext._vptr_DrawContext = (_func_int **)0xbf40000000000000;
  dc.super_DrawContext.m_drawState.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  dc.super_DrawContext.m_drawState.colorFormat = 0x3f800000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertices,
             (Vector<float,_4> *)&dc);
  p_Var4 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((this->super_ShaderRenderCaseInstance).super_TestInstance.m_context)->
              m_progCollection;
  pUVar1 = &dc.super_DrawContext.m_drawState.renderSize;
  dc.super_DrawContext._vptr_DrawContext = (_func_int **)pUVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&dc,"vert","");
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var4,(key_type *)&dc);
  local_488.m_name._M_string_length = *(size_type *)(cVar6._M_node + 2);
  local_488.m_name._M_dataplus._M_p._0_4_ = 1;
  if (shaders.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      shaders.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::
    _M_realloc_insert<vkt::drawutil::Shader>
              (&shaders,(iterator)
                        shaders.
                        super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                        ._M_impl.super__Vector_impl_data._M_finish,(Shader *)&local_488);
  }
  else {
    *(pointer *)
     shaders.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
     _M_impl.super__Vector_impl_data._M_finish = local_488.m_name._M_dataplus._M_p;
    (shaders.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
     _M_impl.super__Vector_impl_data._M_finish)->binary =
         (ProgramBinary *)local_488.m_name._M_string_length;
    shaders.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         shaders.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if ((UVec2 *)dc.super_DrawContext._vptr_DrawContext != pUVar1) {
    operator_delete(dc.super_DrawContext._vptr_DrawContext,
                    (long)dc.super_DrawContext.m_drawState.renderSize.m_data + 1);
  }
  p_Var4 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((this->super_ShaderRenderCaseInstance).super_TestInstance.m_context)->
              m_progCollection;
  dc.super_DrawContext._vptr_DrawContext = (_func_int **)pUVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&dc,"frag","");
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var4,(key_type *)&dc);
  local_488.m_name._M_string_length = *(size_type *)(cVar6._M_node + 2);
  local_488.m_name._M_dataplus._M_p._0_4_ = 0x10;
  if (shaders.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      shaders.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::
    _M_realloc_insert<vkt::drawutil::Shader>
              (&shaders,(iterator)
                        shaders.
                        super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                        ._M_impl.super__Vector_impl_data._M_finish,(Shader *)&local_488);
    topology = extraout_EDX_00;
  }
  else {
    *(pointer *)
     shaders.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
     _M_impl.super__Vector_impl_data._M_finish = local_488.m_name._M_dataplus._M_p;
    (shaders.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
     _M_impl.super__Vector_impl_data._M_finish)->binary =
         (ProgramBinary *)local_488.m_name._M_string_length;
    shaders.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         shaders.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
    topology = extraout_EDX;
  }
  if ((UVec2 *)dc.super_DrawContext._vptr_DrawContext != pUVar1) {
    operator_delete(dc.super_DrawContext._vptr_DrawContext,
                    (long)dc.super_DrawContext.m_drawState.renderSize.m_data + 1);
    topology = extraout_EDX_01;
  }
  drawutil::getPrimitiveTopologyShortName_abi_cxx11_
            ((string *)&refDrawContext,(drawutil *)(ulong)this->m_topology,topology);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&refDrawContext,0,(char *)0x0,0xb45e40);
  local_488.m_name._M_dataplus._M_p = (pointer)&local_488.m_name.field_2;
  psVar8 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_488.m_name.field_2._M_allocated_capacity = *psVar8;
    local_488.m_name.field_2._8_8_ = plVar7[3];
  }
  else {
    local_488.m_name.field_2._M_allocated_capacity = *psVar8;
    local_488.m_name._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_488.m_name._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_488);
  pauVar9 = (uint (*) [2])(plVar7 + 2);
  if ((uint (*) [2])*plVar7 == pauVar9) {
    dc.super_DrawContext.m_drawState.renderSize.m_data = *pauVar9;
    dc.super_DrawContext.m_drawState._16_8_ = plVar7[3];
    dc.super_DrawContext._vptr_DrawContext = (_func_int **)pUVar1;
  }
  else {
    dc.super_DrawContext.m_drawState.renderSize.m_data = *pauVar9;
    dc.super_DrawContext._vptr_DrawContext = (_func_int **)*plVar7;
  }
  dc.super_DrawContext.m_drawState._0_8_ = plVar7[1];
  *plVar7 = (long)pauVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::operator=((string *)&testDesc,(string *)&dc);
  if ((UVec2 *)dc.super_DrawContext._vptr_DrawContext != pUVar1) {
    operator_delete(dc.super_DrawContext._vptr_DrawContext,
                    (long)dc.super_DrawContext.m_drawState.renderSize.m_data + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488.m_name._M_dataplus._M_p != &local_488.m_name.field_2) {
    operator_delete(local_488.m_name._M_dataplus._M_p,
                    local_488.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((UVec2 *)refDrawContext.super_DrawContext._vptr_DrawContext !=
      &refDrawContext.super_DrawContext.m_drawState.renderSize) {
    operator_delete(refDrawContext.super_DrawContext._vptr_DrawContext,
                    (long)refDrawContext.super_DrawContext.m_drawState.renderSize.m_data + 1);
  }
  drawutil::DrawState::DrawState(&drawState,this->m_topology,0x10,0x10);
  drawCallData.vertices = &vertices;
  vulkanProgram.shaders = &shaders;
  drawutil::VulkanDrawContext::VulkanDrawContext
            (&dc,(this->super_ShaderRenderCaseInstance).super_TestInstance.m_context,&drawState,
             &drawCallData,&vulkanProgram);
  drawutil::VulkanDrawContext::draw(&dc);
  refDrawContext.m_vertexShader = &vertexShader.super_VertexShader;
  refDrawContext.super_DrawContext.m_drawState.topology = drawState.topology;
  refDrawContext.super_DrawContext.m_drawState.colorFormat = drawState.colorFormat;
  refDrawContext.super_DrawContext.m_drawState.renderSize = drawState.renderSize;
  refDrawContext.super_DrawContext.m_drawState.depthClampEnable = drawState.depthClampEnable;
  refDrawContext.super_DrawContext.m_drawState.blendEnable = drawState.blendEnable;
  refDrawContext.super_DrawContext.m_drawState._18_2_ = drawState._18_2_;
  refDrawContext.super_DrawContext.m_drawState.lineWidth = drawState.lineWidth;
  refDrawContext.super_DrawContext.m_drawState.numPatchControlPoints =
       drawState.numPatchControlPoints;
  refDrawContext.super_DrawContext.m_drawCallData = drawCallData;
  refDrawContext.super_DrawContext._vptr_DrawContext =
       (_func_int **)&PTR__ReferenceDrawContext_00d50f80;
  refDrawContext.m_fragmentShader = &fragmentShader.super_FragmentShader;
  tcu::TextureLevel::TextureLevel(&refDrawContext.m_refImage);
  drawutil::ReferenceDrawContext::draw(&refDrawContext);
  local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"reference","");
  local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,"reference","");
  drawutil::ReferenceDrawContext::getColorPixels(&local_318,&refDrawContext);
  local_4b8 = local_318.m_format;
  drawutil::ReferenceDrawContext::getColorPixels(&local_3a8,&refDrawContext);
  width = local_3a8.m_size.m_data[0];
  drawutil::ReferenceDrawContext::getColorPixels(&local_280,&refDrawContext);
  height = local_280.m_size.m_data[1];
  drawutil::ReferenceDrawContext::getColorPixels(&local_2a8,&refDrawContext);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_3f0,&local_4b8,width,height,1,local_2a8.m_data);
  pCVar10 = &local_3f0;
  tcu::LogImage::LogImage(&local_488,&local_4f8,&local_518,pCVar10,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write(&local_488,(int)local_4b0,__buf,(size_t)pCVar10);
  paVar2 = &local_488.m_description.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488.m_description._M_dataplus._M_p != paVar2) {
    operator_delete(local_488.m_description._M_dataplus._M_p,
                    local_488.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488.m_name._M_dataplus._M_p != &local_488.m_name.field_2) {
    operator_delete(local_488.m_name._M_dataplus._M_p,
                    local_488.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
  }
  local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"result","");
  local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,"result","");
  drawutil::VulkanDrawContext::getColorPixels(&local_318,&dc);
  local_4b8 = local_318.m_format;
  drawutil::VulkanDrawContext::getColorPixels(&local_3a8,&dc);
  drawutil::VulkanDrawContext::getColorPixels(&local_280,&dc);
  drawutil::VulkanDrawContext::getColorPixels(&local_2a8,&dc);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_3f0,&local_4b8,local_3a8.m_size.m_data[0],local_280.m_size.m_data[1],1,
             local_2a8.m_data);
  pCVar10 = &local_3f0;
  tcu::LogImage::LogImage(&local_488,&local_4f8,&local_518,pCVar10,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write(&local_488,(int)local_4b0,__buf_00,(size_t)pCVar10);
  paVar3 = &local_488.m_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488.m_description._M_dataplus._M_p != paVar2) {
    operator_delete(local_488.m_description._M_dataplus._M_p,
                    local_488.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488.m_name._M_dataplus._M_p != paVar3) {
    operator_delete(local_488.m_name._M_dataplus._M_p,
                    local_488.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
  }
  log = ((this->super_ShaderRenderCaseInstance).super_TestInstance.m_context)->m_testCtx->m_log;
  drawutil::ReferenceDrawContext::getColorPixels
            ((ConstPixelBufferAccess *)&local_488,&refDrawContext);
  drawutil::VulkanDrawContext::getColorPixels(&local_3f0,&dc);
  local_318.m_format.order = R;
  local_318.m_format.type = SNORM_INT8;
  local_318.m_size.m_data[0] = 0;
  local_318.m_size.m_data[1] = 0;
  local_3a8.m_format.order = A;
  local_3a8.m_format.type = SNORM_INT16;
  local_3a8.m_size.m_data[0] = 0;
  bVar5 = tcu::intThresholdPositionDeviationCompare
                    (log,"ComparisonResult","Image comparison result",
                     (ConstPixelBufferAccess *)&local_488,&local_3f0,(UVec4 *)&local_318,
                     (IVec3 *)&local_3a8,false,COMPARE_LOG_RESULT);
  if (bVar5) {
    std::__cxx11::string::append((char *)&testDesc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_488,testDesc._M_dataplus._M_p,(allocator<char> *)&local_3f0);
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_488.m_name._M_dataplus._M_p,
               local_488.m_name._M_dataplus._M_p + local_488.m_name._M_string_length);
  }
  else {
    std::__cxx11::string::append((char *)&testDesc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_488,testDesc._M_dataplus._M_p,(allocator<char> *)&local_3f0);
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_488.m_name._M_dataplus._M_p,
               local_488.m_name._M_dataplus._M_p + local_488.m_name._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488.m_name._M_dataplus._M_p != paVar3) {
    operator_delete(local_488.m_name._M_dataplus._M_p,
                    local_488.m_name.field_2._M_allocated_capacity + 1);
  }
  drawutil::ReferenceDrawContext::~ReferenceDrawContext(&refDrawContext);
  drawutil::VulkanDrawContext::~VulkanDrawContext(&dc);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)testDesc._M_dataplus._M_p != &testDesc.field_2) {
    operator_delete(testDesc._M_dataplus._M_p,
                    CONCAT71(testDesc.field_2._M_allocated_capacity._1_7_,
                             testDesc.field_2._M_local_buf[0]) + 1);
  }
  rr::FragmentShader::~FragmentShader(&fragmentShader.super_FragmentShader);
  rr::VertexShader::~VertexShader(&vertexShader.super_VertexShader);
  if (shaders.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(shaders.
                    super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)shaders.
                          super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)shaders.
                          super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vertices.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vertices.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vertices.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

TestStatus BuiltinGlFrontFacingCaseInstance::iterate (void)
{
	TestLog&					log				= m_context.getTestContext().getLog();
	std::vector<Vec4>			vertices;
	std::vector<Shader>			shaders;
	FrontFacingVertexShader		vertexShader;
	FrontFacingFragmentShader	fragmentShader;
	std::string					testDesc;

	vertices.push_back(Vec4( -0.75f,	-0.75f,	0.0f,	1.0f));
	vertices.push_back(Vec4(  0.0f,		-0.75f,	0.0f,	1.0f));
	vertices.push_back(Vec4( -0.37f,	0.75f,	0.0f,	1.0f));
	vertices.push_back(Vec4(  0.37f,	0.75f,	0.0f,	1.0f));
	vertices.push_back(Vec4(  0.75f,	-0.75f,	0.0f,	1.0f));
	vertices.push_back(Vec4(  0.0f,		-0.75f,	0.0f,	1.0f));

	shaders.push_back(Shader(VK_SHADER_STAGE_VERTEX_BIT, m_context.getBinaryCollection().get("vert")));
	shaders.push_back(Shader(VK_SHADER_STAGE_FRAGMENT_BIT, m_context.getBinaryCollection().get("frag")));

	testDesc = "gl_FrontFacing " + getPrimitiveTopologyShortName(m_topology) + " ";

	DrawState					drawState		(m_topology, FRONTFACE_RENDERWIDTH, FRONTFACE_RENDERHEIGHT);
	DrawCallData				drawCallData	(vertices);
	VulkanProgram				vulkanProgram	(shaders);

	VulkanDrawContext			dc(m_context, drawState, drawCallData, vulkanProgram);
	dc.draw();

	ReferenceDrawContext		refDrawContext(drawState, drawCallData, vertexShader, fragmentShader);
	refDrawContext.draw();

	log << TestLog::Image( "reference",
							"reference",
							tcu::ConstPixelBufferAccess(tcu::TextureFormat(
									refDrawContext.getColorPixels().getFormat()),
									refDrawContext.getColorPixels().getWidth(),
									refDrawContext.getColorPixels().getHeight(),
									1,
									refDrawContext.getColorPixels().getDataPtr()));

	log << TestLog::Image(	"result",
							"result",
							tcu::ConstPixelBufferAccess(tcu::TextureFormat(
									dc.getColorPixels().getFormat()),
									dc.getColorPixels().getWidth(),
									dc.getColorPixels().getHeight(),
									1,
									dc.getColorPixels().getDataPtr()));

	if (tcu::intThresholdPositionDeviationCompare(m_context.getTestContext().getLog(),
												  "ComparisonResult",
												  "Image comparison result",
												  refDrawContext.getColorPixels(),
												  dc.getColorPixels(),
												  UVec4(0u),
												  IVec3(1,1,0),
												  false,
												  tcu::COMPARE_LOG_RESULT))
	{
		testDesc += "passed";
		return tcu::TestStatus::pass(testDesc.c_str());
	}
	else
	{
		testDesc += "failed";
		return tcu::TestStatus::fail(testDesc.c_str());
	}
}